

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O3

int64_t file_stdio_ftell(ALLEGRO_FILE *f)

{
  int errnum;
  undefined8 *puVar1;
  __off_t _Var2;
  int *piVar3;
  
  puVar1 = (undefined8 *)al_get_file_userdata(f);
  _Var2 = ftello((FILE *)*puVar1);
  if (_Var2 == -1) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    *(int *)(puVar1 + 1) = errnum;
    al_set_errno(errnum);
  }
  return _Var2;
}

Assistant:

static int64_t file_stdio_ftell(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);
   int64_t ret;

#if defined(ALLEGRO_HAVE_FTELLO)
   ret = ftello(userdata->fp);
#elif defined(ALLEGRO_HAVE_FTELLI64)
   ret = _ftelli64(userdata->fp);
#else
   ret = ftell(userdata->fp);
#endif
   if (ret == -1) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return ret;
}